

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlgorithmAreaAverageRgb.cpp
# Opt level: O2

QString * __thiscall
AlgorithmAreaAverageRgb::GetDescription
          (QString *__return_storage_ptr__,AlgorithmAreaAverageRgb *this)

{
  QString::QString(__return_storage_ptr__,
                   "<p>Averages the colour in two zones in the RGB image and compares the average colour in the same zones in the target image. Then  pixels are swapped between the zones to minimise RGB colour error</p><p>Error is the sum of the difference between each of the red, green, & blue colour channels, for both pixels, when compared to the target image.</p>"
                  );
  return __return_storage_ptr__;
}

Assistant:

QString AlgorithmAreaAverageRgb::GetDescription()
{
    return "<p>Averages the colour in two zones in the RGB image and compares "
           "the average colour in the same zones in the target "
           "image. Then  pixels are swapped between the zones to minimise RGB "
           "colour error</p>"
           "<p>Error is the sum of the difference between each of the red, "
           "green, & blue colour channels, for both pixels, when compared to "
           "the target image.</p>";
}